

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree.cxx
# Opt level: O2

void __thiscall Fl_Tree::hposition(Fl_Tree *this,int pos)

{
  return;
}

Assistant:

void Fl_Tree::hposition(int pos) {
#if FLTK_ABI_VERSION >= 10303
  if (pos < 0) pos = 0;
  if (pos > _hscroll->maximum()) pos = (int)_hscroll->maximum();
  if (pos == _hscroll->value()) return;
  _hscroll->value(pos);
  redraw();
#endif
}